

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,bool isSRGB,PixelBufferAccess *colorBuffer)

{
  ulong uVar1;
  ulong uVar2;
  Vec3 *v;
  Vec4 combinedColor;
  VecAccess<float,_4,_3> local_60;
  Vector<float,_4> *local_48;
  int iStack_40;
  float fStack_3c;
  
  v = &this->m_sampleRegister[0].blendedRGB;
  for (uVar2 = 0; uVar2 != 0x40; uVar2 = uVar2 + 1) {
    if (((SampleData *)(v + -7))->isAlive == true) {
      uVar1 = (ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_48);
      local_60.m_index[0] = 0;
      local_60.m_index[1] = 1;
      local_60.m_index[2] = 2;
      local_60.m_vector = (Vector<float,_4> *)&local_48;
      tcu::VecAccess<float,_4,_3>::operator=(&local_60,v);
      fStack_3c = v[1].m_data[0];
      if (isSRGB) {
        tcu::linearToSRGB((tcu *)&local_60,(Vector<float,_4> *)&local_48);
        local_48 = local_60.m_vector;
        iStack_40 = local_60.m_index[0];
        fStack_3c = (float)local_60.m_index[1];
      }
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,(Vector<float,_4> *)&local_48,
                 (int)((long)uVar1 % (long)numSamplesPerFragment),
                 inputFragments[(int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset].
                 pixelCoord.m_data[0],
                 inputFragments[(int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset].
                 pixelCoord.m_data[1]);
    }
    v = v + 0xb;
  }
  return;
}

Assistant:

void FragmentProcessor::executeColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				combinedColor;

			combinedColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			combinedColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				combinedColor = tcu::linearToSRGB(combinedColor);

			colorBuffer.setPixel(combinedColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}